

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parameters.pb.h
# Opt level: O2

DoubleRange * __thiscall
CoreML::Specification::DoubleParameter::mutable_range(DoubleParameter *this)

{
  DoubleRange *this_00;
  
  if (this->_oneof_case_[0] == 10) {
    this_00 = (this->AllowedValues_).range_;
  }
  else {
    clear_AllowedValues(this);
    this->_oneof_case_[0] = 10;
    this_00 = (DoubleRange *)operator_new(0x28);
    DoubleRange::DoubleRange(this_00);
    (this->AllowedValues_).range_ = this_00;
  }
  return this_00;
}

Assistant:

inline ::CoreML::Specification::DoubleRange* DoubleParameter::mutable_range() {
  if (!has_range()) {
    clear_AllowedValues();
    set_has_range();
    AllowedValues_.range_ = new ::CoreML::Specification::DoubleRange;
  }
  // @@protoc_insertion_point(field_mutable:CoreML.Specification.DoubleParameter.range)
  return AllowedValues_.range_;
}